

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint8_t * svb_decode_avx_d1_init
                    (uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  xmm_t Prev_00;
  xmm_t Prev_01;
  xmm_t Prev_02;
  xmm_t Prev_03;
  xmm_t Prev_04;
  xmm_t Prev_05;
  xmm_t Prev_06;
  xmm_t Prev_07;
  xmm_t Prev_08;
  xmm_t Prev_09;
  xmm_t Prev_10;
  xmm_t Prev_11;
  xmm_t Prev_12;
  xmm_t Prev_13;
  xmm_t Prev_14;
  xmm_t Prev_15;
  xmm_t Vec;
  xmm_t Vec_00;
  xmm_t Vec_01;
  xmm_t Vec_02;
  xmm_t Vec_03;
  xmm_t Vec_04;
  xmm_t Vec_05;
  xmm_t Vec_06;
  xmm_t Vec_07;
  xmm_t Vec_08;
  xmm_t Vec_09;
  xmm_t Vec_10;
  xmm_t Vec_11;
  xmm_t Vec_12;
  xmm_t Vec_13;
  xmm_t Vec_14;
  xmm_t Prev_16;
  xmm_t Prev_17;
  xmm_t Prev_18;
  xmm_t Prev_19;
  xmm_t Prev_20;
  xmm_t Prev_21;
  xmm_t Prev_22;
  xmm_t Vec_15;
  xmm_t Vec_16;
  xmm_t Vec_17;
  xmm_t Vec_18;
  xmm_t Vec_19;
  xmm_t Vec_20;
  xmm_t Vec_21;
  xmm_t Vec_22;
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  ulong in_RCX;
  undefined1 (*in_RDX) [16];
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  longlong lVar14;
  longlong lVar15;
  uint32_t *out_00;
  uint64_t consumedkeys;
  uint64_t keys_1;
  uint64_t keys;
  uint64_t nextkeys;
  uint64_t *keyPtr64;
  int64_t Offset;
  xmm_t Data;
  xmm_t Prev;
  uint64_t keybytes;
  uint32_t in_stack_fffffffffffffe70;
  uint uVar16;
  uint in_stack_fffffffffffffe74;
  uint uVar17;
  uint8_t *in_stack_fffffffffffffe78;
  uint8_t *in_stack_fffffffffffffe80;
  uint32_t *in_stack_fffffffffffffe88;
  uint32_t *in_stack_fffffffffffffeb8;
  undefined1 (*local_128 [2]) [16];
  long local_118;
  ulong local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 (*local_80) [16];
  undefined1 (*local_78) [16];
  undefined1 (*local_70) [16];
  undefined1 (*local_68) [16];
  undefined1 (*local_60) [16];
  undefined1 (*local_58) [16];
  undefined1 (*local_50) [16];
  ulong local_48;
  undefined8 uStack_40;
  ulong *local_30;
  undefined1 local_28 [16];
  
  uVar16 = in_stack_fffffffffffffe70;
  local_128[0] = in_RDX;
  local_118 = in_RDI;
  if (7 < in_RCX >> 2) {
    auVar8 = vpinsrd_avx(ZEXT416(in_R8D),in_R8D,1);
    auVar8 = vpinsrd_avx(auVar8,in_R8D,2);
    local_28 = vpinsrd_avx(auVar8,in_R8D,3);
    lVar10 = (long)-(in_RCX >> 2) / 8 + 1;
    in_stack_fffffffffffffe88 = (uint32_t *)(in_RSI + lVar10 * -8);
    in_stack_fffffffffffffe80 = *(uint8_t **)(in_stack_fffffffffffffe88 + lVar10 * 2);
    out_00 = (uint32_t *)local_28._0_8_;
    for (; uVar16 = (uint)in_stack_fffffffffffffe80, lVar10 != 0; lVar10 = lVar10 + 1) {
      puVar13 = *(uint8_t **)(in_stack_fffffffffffffe88 + lVar10 * 2 + 2);
      if (in_stack_fffffffffffffe80 == (uint8_t *)0x0) {
        local_50 = local_128[0];
        local_98 = vlddqu_avx(*local_128[0]);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_98._0_8_;
        auVar8 = vpmovzxbw_avx(auVar1);
        lVar14 = auVar8._0_8_;
        Vec_15[1] = (longlong)out_00;
        Vec_15[0] = auVar8._8_8_;
        Prev_16[1] = lVar14;
        Prev_16[0] = lVar10;
        _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_15,Prev_16);
        local_58 = (undefined1 (*) [16])(*local_128[0] + 8);
        local_a8 = vlddqu_avx(*local_58);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_a8._0_8_;
        auVar8 = vpmovzxbw_avx(auVar2);
        lVar15 = auVar8._0_8_;
        Vec_16[1] = lVar14;
        Vec_16[0] = auVar8._8_8_;
        Prev_17[1] = lVar15;
        Prev_17[0] = lVar10;
        _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_16,Prev_17);
        local_60 = local_128[0] + 1;
        local_b8 = vlddqu_avx(*local_60);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_b8._0_8_;
        auVar8 = vpmovzxbw_avx(auVar3);
        lVar14 = auVar8._0_8_;
        Vec_17[1] = lVar15;
        Vec_17[0] = auVar8._8_8_;
        Prev_18[1] = lVar14;
        Prev_18[0] = lVar10;
        _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_17,Prev_18);
        local_68 = (undefined1 (*) [16])(local_128[0][1] + 8);
        local_c8 = vlddqu_avx(*local_68);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_c8._0_8_;
        auVar8 = vpmovzxbw_avx(auVar4);
        out_00 = auVar8._0_8_;
        Vec_18[1] = lVar14;
        Vec_18[0] = auVar8._8_8_;
        Prev_19[1] = (longlong)out_00;
        Prev_19[0] = lVar10;
        _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_18,Prev_19);
        local_128[0] = local_128[0] + 2;
      }
      else {
        _decode_avx(uVar16 & 0xff,(uint8_t **)local_128);
        Vec[1] = (longlong)in_stack_fffffffffffffe88;
        Vec[0] = (longlong)puVar13;
        Prev_00[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_00[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_00[1] = (longlong)in_stack_fffffffffffffe80;
        _write_avx_d1(out_00,Vec,Prev_00);
        _decode_avx((uint)((ulong)in_stack_fffffffffffffe80 >> 8) & 0xff,(uint8_t **)local_128);
        Vec_00[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_00[0] = (longlong)puVar13;
        Prev_01[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_01[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_01[1] = (longlong)in_stack_fffffffffffffe80;
        _write_avx_d1(out_00,Vec_00,Prev_01);
        uVar11 = (ulong)in_stack_fffffffffffffe80 >> 0x10;
        _decode_avx((uint)((ulong)in_stack_fffffffffffffe80 >> 0x10) & 0xff,(uint8_t **)local_128);
        Vec_01[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_01[0] = (longlong)puVar13;
        Prev_02[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_02[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_02[1] = uVar11;
        _write_avx_d1(out_00,Vec_01,Prev_02);
        _decode_avx((uint)(uVar11 >> 8) & 0xff,(uint8_t **)local_128);
        Vec_02[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_02[0] = (longlong)puVar13;
        Prev_03[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_03[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_03[1] = uVar11;
        _write_avx_d1(out_00,Vec_02,Prev_03);
        uVar12 = uVar11 >> 0x10;
        _decode_avx((uint)(uVar11 >> 0x10) & 0xff,(uint8_t **)local_128);
        Vec_03[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_03[0] = (longlong)puVar13;
        Prev_04[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_04[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_04[1] = uVar12;
        _write_avx_d1(out_00,Vec_03,Prev_04);
        _decode_avx((uint)(uVar12 >> 8) & 0xff,(uint8_t **)local_128);
        Vec_04[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_04[0] = (longlong)puVar13;
        Prev_05[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_05[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_05[1] = uVar12;
        _write_avx_d1(out_00,Vec_04,Prev_05);
        in_stack_fffffffffffffe80 = (uint8_t *)(uVar12 >> 0x10);
        _decode_avx((uint)(uVar12 >> 0x10) & 0xff,(uint8_t **)local_128);
        Vec_05[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_05[0] = (longlong)puVar13;
        Prev_06[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_06[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_06[1] = (longlong)in_stack_fffffffffffffe80;
        _write_avx_d1(out_00,Vec_05,Prev_06);
        _decode_avx((uint)((ulong)in_stack_fffffffffffffe80 >> 8) & 0xff,(uint8_t **)local_128);
        Vec_06[1] = (longlong)in_stack_fffffffffffffe88;
        Vec_06[0] = (longlong)puVar13;
        Prev_07[0]._4_4_ = in_stack_fffffffffffffe74;
        Prev_07[0]._0_4_ = in_stack_fffffffffffffe70;
        Prev_07[1] = (longlong)in_stack_fffffffffffffe80;
        _write_avx_d1(out_00,Vec_06,Prev_07);
      }
      local_118 = local_118 + 0x80;
      in_stack_fffffffffffffe78 = in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe80 = puVar13;
    }
    in_stack_fffffffffffffe74 = (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    if (in_stack_fffffffffffffe80 == (uint8_t *)0x0) {
      local_70 = local_128[0];
      local_d8 = vlddqu_avx(*local_128[0]);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_d8._0_8_;
      auVar8 = vpmovzxbw_avx(auVar8);
      uVar11 = auVar8._0_8_;
      Vec_19[1] = (longlong)out_00;
      Vec_19[0] = auVar8._8_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar11;
      _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_19,(xmm_t)(auVar9 << 0x40));
      local_78 = (undefined1 (*) [16])(*local_128[0] + 8);
      local_e8 = vlddqu_avx(*local_78);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_e8._0_8_;
      auVar8 = vpmovzxbw_avx(auVar5);
      lVar14 = auVar8._0_8_;
      Vec_20[1] = uVar11;
      Vec_20[0] = auVar8._8_8_;
      Prev_20[1] = lVar14;
      Prev_20[0] = lVar10;
      _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_20,Prev_20);
      local_80 = local_128[0] + 1;
      local_f8 = vlddqu_avx(*local_80);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_f8._0_8_;
      auVar8 = vpmovzxbw_avx(auVar6);
      lVar15 = auVar8._0_8_;
      Vec_21[1] = lVar14;
      Vec_21[0] = auVar8._8_8_;
      Prev_21[1] = lVar15;
      Prev_21[0] = lVar10;
      _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_21,Prev_21);
      local_30 = (ulong *)(local_128[0][1] + 8);
      local_108 = *local_30;
      uStack_40 = 0;
      uStack_100 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_108;
      auVar8 = vpmovzxbw_avx(auVar7);
      Vec_22[1] = lVar15;
      Vec_22[0] = auVar8._8_8_;
      Prev_22[1] = auVar8._0_8_;
      Prev_22[0] = lVar10;
      local_48 = local_108;
      _write_16bit_avx_d1(in_stack_fffffffffffffeb8,Vec_22,Prev_22);
      local_128[0] = local_128[0] + 2;
    }
    else {
      _decode_avx(uVar16 & 0xff,(uint8_t **)local_128);
      Vec_07[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_07[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_08[0]._4_4_ = in_stack_fffffffffffffe74;
      Prev_08[0]._0_4_ = uVar16;
      Prev_08[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_07,Prev_08);
      _decode_avx((uint)(CONCAT44(in_stack_fffffffffffffe74,uVar16) >> 8) & 0xff,
                  (uint8_t **)local_128);
      Vec_08[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_08[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_09[0]._4_4_ = in_stack_fffffffffffffe74;
      Prev_09[0]._0_4_ = uVar16;
      Prev_09[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_08,Prev_09);
      uVar16 = (uint)(CONCAT44(in_stack_fffffffffffffe74,uVar16) >> 0x10);
      uVar17 = in_stack_fffffffffffffe74 >> 0x10;
      _decode_avx(uVar16 & 0xff,(uint8_t **)local_128);
      Vec_09[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_09[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_10[0]._4_4_ = uVar17;
      Prev_10[0]._0_4_ = uVar16;
      Prev_10[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_09,Prev_10);
      _decode_avx((uint)(CONCAT44(uVar17,uVar16) >> 8) & 0xff,(uint8_t **)local_128);
      Vec_10[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_10[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_11[0]._4_4_ = uVar17;
      Prev_11[0]._0_4_ = uVar16;
      Prev_11[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_10,Prev_11);
      uVar16 = (uint)(CONCAT44(uVar17,uVar16) >> 0x10);
      uVar17 = uVar17 >> 0x10;
      _decode_avx(uVar16 & 0xff,(uint8_t **)local_128);
      Vec_11[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_11[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_12[0]._4_4_ = uVar17;
      Prev_12[0]._0_4_ = uVar16;
      Prev_12[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_11,Prev_12);
      _decode_avx((uint)(CONCAT44(uVar17,uVar16) >> 8) & 0xff,(uint8_t **)local_128);
      Vec_12[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_12[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_13[0]._4_4_ = uVar17;
      Prev_13[0]._0_4_ = uVar16;
      Prev_13[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_12,Prev_13);
      uVar16 = (uint)(CONCAT44(uVar17,uVar16) >> 0x10);
      in_stack_fffffffffffffe74 = uVar17 >> 0x10;
      _decode_avx(uVar16 & 0xff,(uint8_t **)local_128);
      Vec_13[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_13[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_14[0]._4_4_ = in_stack_fffffffffffffe74;
      Prev_14[0]._0_4_ = uVar16;
      Prev_14[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_13,Prev_14);
      _decode_avx((uint)(CONCAT44(in_stack_fffffffffffffe74,uVar16) >> 8) & 0xff,
                  (uint8_t **)local_128);
      Vec_14[1] = (longlong)in_stack_fffffffffffffe88;
      Vec_14[0] = (longlong)in_stack_fffffffffffffe80;
      Prev_15[0]._4_4_ = in_stack_fffffffffffffe74;
      Prev_15[0]._0_4_ = uVar16;
      Prev_15[1] = (longlong)in_stack_fffffffffffffe78;
      _write_avx_d1(out_00,Vec_14,Prev_15);
    }
    local_118 = local_118 + 0x80;
  }
  puVar13 = svb_decode_scalar_d1_init
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78
                       ,in_stack_fffffffffffffe74,uVar16);
  return puVar13;
}

Assistant:

uint8_t *svb_decode_avx_d1_init(uint32_t *out, uint8_t *__restrict__ keyPtr,
                                uint8_t *__restrict__ dataPtr, uint64_t count,
                                uint32_t prev) {
  uint64_t keybytes = count / 4; // number of key bytes
  if (keybytes >= 8) {
    xmm_t Prev = _mm_set1_epi32(prev);
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        Prev = _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      Prev = _write_avx_d1(out, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 4, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 8, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 12, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 16, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 20, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 24, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 28, Data, Prev);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        Prev = _write_avx_d1(out, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 4, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 8, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 12, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 16, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 20, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 24, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        _write_avx_d1(out + 28, Data, Prev);

        out += 32;
      }
    }
    prev = out[-1];
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr,
                                   count & 31, prev);
}